

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O0

size_t __thiscall merlin::factor::sample(factor *this)

{
  size_t sVar1;
  const_reference pvVar2;
  double dVar3;
  value vVar4;
  ulong local_30;
  size_t i;
  double y;
  double x;
  factor *this_local;
  
  y = 0.0;
  dVar3 = randu();
  vVar4 = sum(this);
  local_30 = 0;
  while( true ) {
    sVar1 = num_states(this);
    if (sVar1 <= local_30) {
      sVar1 = num_states(this);
      return sVar1;
    }
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&this->t_,local_30);
    y = *pvVar2 + y;
    if (dVar3 * vVar4 < y) break;
    local_30 = local_30 + 1;
  }
  return local_30;
}

Assistant:

size_t sample() const {
		double x = 0.0, y = randu() * sum();
		for (size_t i = 0; i < num_states(); ++i)
			if ((x += t_[i]) > y)
				return i;
		return num_states();
	}